

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qorderedmutexlocker_p.h
# Opt level: O1

bool QOrderedMutexLocker::relock(QBasicMutex *mtx1,QBasicMutex *mtx2)

{
  __pointer_type pQVar1;
  QBasicMutex *this;
  bool bVar2;
  
  if (mtx1 == mtx2) goto LAB_002bdcba;
  pQVar1 = (mtx2->d_ptr)._q_value._M_b._M_p;
  if (mtx1 < mtx2) {
    this = mtx2;
    if (pQVar1 == (__pointer_type)0x0) {
      LOCK();
      bVar2 = (mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (mtx2->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
joined_r0x002bdcb3:
      if (bVar2) goto LAB_002bdcba;
    }
  }
  else {
    if (pQVar1 == (__pointer_type)0x0) {
      LOCK();
      bVar2 = (mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (mtx2->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar2) goto LAB_002bdcba;
    }
    LOCK();
    pQVar1 = (mtx1->d_ptr)._q_value._M_b._M_p;
    (mtx1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(mtx1,pQVar1);
    }
    if ((mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar2 = (mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (mtx2->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar2) goto LAB_002bdc91;
    }
    else {
LAB_002bdc91:
      QBasicMutex::lockInternal(mtx2);
    }
    this = mtx1;
    if ((mtx1->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar2 = (mtx1->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (mtx1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      goto joined_r0x002bdcb3;
    }
  }
  QBasicMutex::lockInternal(this);
LAB_002bdcba:
  return mtx1 != mtx2;
}

Assistant:

static bool relock(QBasicMutex *mtx1, QBasicMutex *mtx2)
    {
        // mtx1 is already locked, mtx2 not... do we need to unlock and relock?
        if (mtx1 == mtx2)
            return false;
        if (std::less<QBasicMutex *>()(mtx1, mtx2)) {
            mtx2->lock();
            return true;
        }
        if (!mtx2->tryLock()) {
            mtx1->unlock();
            mtx2->lock();
            mtx1->lock();
        }
        return true;
    }